

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O3

void __thiscall chrono::ChMarker::UpdatedExternalTime(ChMarker *this,double prevtime,double mtime)

{
  ChFrameMoving<double> *local;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  long in_RCX;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Coordsys m_rel_pos_dtdt;
  Coordsys m_rel_pos_dt;
  ChQuaternion<double> local_e8;
  ChQuaternion<double> local_c8;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double local_88;
  double dStack_80;
  double local_78;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_48;
  
  if (this->motion_type != M_MOTION_EXTERNAL) {
    this->motion_type = M_MOTION_FUNCTIONS;
    dVar11 = (this->last_rel_coord).pos.m_data[0];
    dVar8 = (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
    if ((((dVar11 != dVar8) || (NAN(dVar11) || NAN(dVar8))) ||
        (dVar11 = (this->last_rel_coord).pos.m_data[1],
        dVar8 = (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1],
        dVar11 != dVar8)) ||
       (((NAN(dVar11) || NAN(dVar8) ||
         (dVar11 = (this->last_rel_coord).pos.m_data[2],
         dVar8 = (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2],
         dVar11 != dVar8)) ||
        ((NAN(dVar11) || NAN(dVar8) ||
         (bVar3 = Qequal(&(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot,
                         &(this->last_rel_coord).rot), !bVar3)))))) {
      dVar11 = mtime - prevtime;
      if (((dVar11 != 0.0) || (NAN(dVar11))) &&
         (auVar1._8_8_ = 0, auVar1._0_8_ = dVar11, auVar5._8_8_ = 0x7fffffffffffffff,
         auVar5._0_8_ = 0x7fffffffffffffff, auVar5 = vandpd_avx512vl(auVar1,auVar5),
         auVar5._0_8_ < 0.1)) {
        dVar8 = mtime;
        (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_vptr_ChFunction[4])();
        if ((dVar8 == 0.0) && (!NAN(dVar8))) {
          dVar8 = mtime;
          (*((this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          if ((dVar8 == 0.0) && (!NAN(dVar8))) {
            dVar8 = mtime;
            (*((this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_ChFunction[4])();
            if ((dVar8 == 0.0) && (!NAN(dVar8))) {
              (*((this->motion_ang).
                 super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_ChFunction[4])();
              if ((mtime == 0.0) &&
                 ((((!NAN(mtime) &&
                    (iVar4 = (*((this->motion_X).
                                super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->_vptr_ChFunction[3])(), iVar4 == 1)) &&
                   (iVar4 = (*((this->motion_Y).
                               super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->_vptr_ChFunction[3])(), iVar4 == 1)) &&
                  ((iVar4 = (*((this->motion_Z).
                               super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->_vptr_ChFunction[3])(), iVar4 == 1 &&
                   (iVar4 = (*((this->motion_ang).
                               super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->_vptr_ChFunction[3])(), iVar4 == 1)))))) {
                local = &this->super_ChFrameMoving<double>;
                dVar11 = 1.0 / dVar11;
                dVar8 = dVar11 * ((this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.
                                  pos.m_data[2] - (this->last_rel_coord).pos.m_data[2]);
                auVar5 = vsubpd_avx(*(undefined1 (*) [16])
                                     (this->super_ChFrameMoving<double>).super_ChFrame<double>.coord
                                     .pos.m_data,
                                    *(undefined1 (*) [16])(this->last_rel_coord).pos.m_data);
                dVar9 = dVar11 * auVar5._0_8_;
                dVar10 = dVar11 * auVar5._8_8_;
                local_88 = dVar9;
                dStack_80 = dVar10;
                local_78 = dVar8;
                Qsub(&(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot,
                     &(this->last_rel_coord).rot);
                Qscale(&local_c8,&local_e8,dVar11);
                auVar2._8_8_ = dVar10;
                auVar2._0_8_ = dVar9;
                local_70.m_data[0] = local_c8.m_data[0];
                local_70.m_data[1] = local_c8.m_data[1];
                local_70.m_data[2] = local_c8.m_data[2];
                local_70.m_data[3] = local_c8.m_data[3];
                auVar5 = vsubpd_avx(auVar2,*(undefined1 (*) [16])
                                            (this->last_rel_coord_dt).pos.m_data);
                local_c8.m_data[0] = auVar5._0_8_ * dVar11;
                local_c8.m_data[1] = auVar5._8_8_ * dVar11;
                local_c8.m_data[2] = (dVar8 - (this->last_rel_coord_dt).pos.m_data[2]) * dVar11;
                Qsub(&local_70,&(this->last_rel_coord_dt).rot);
                Qscale(&local_e8,&local_48,dVar11);
                local_c8.m_data[3] = local_e8.m_data[0];
                dStack_a8 = local_e8.m_data[1];
                dStack_a0 = local_e8.m_data[2];
                dStack_98 = local_e8.m_data[3];
                (*(this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[6])
                          (local,&local_88);
                (*(this->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0xb])
                          (local,&local_c8);
                if (this->Body != (ChBody *)0x0) {
                  ChFrameMoving<double>::TransformLocalToParent
                            (&(this->Body->super_ChBodyFrame).super_ChFrameMoving<double>,local,
                             &this->abs_frame);
                }
                this->motion_type = M_MOTION_KEYFRAMED;
              }
            }
          }
        }
      }
    }
    this->last_time = (this->super_ChObj).ChTime;
    auVar7._0_24_ =
         *(undefined1 (*) [24])&(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos;
    auVar7._24_32_ =
         *(undefined1 (*) [32])&(this->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot;
    auVar7._56_8_ =
         (this->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar6 = vgatherdpd_avx512vl(*(undefined4 *)
                                  ((long)(&(this->super_ChFrameMoving<double>).super_ChFrame<double>
                                           .coord + -2) + 0x30 + in_RCX));
    auVar7 = vinsertf64x4_avx512f(auVar7,auVar6,1);
    (this->last_rel_coord).pos = (ChVector<double>)SUB5624(auVar7._0_56_,0);
    (this->last_rel_coord).rot = (ChQuaternion<double>)SUB5632(auVar7._0_56_,0x18);
    (this->last_rel_coord_dt).pos.m_data[0] = (double)auVar7._56_8_;
    dVar11 = (this->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
    dVar8 = (this->super_ChFrameMoving<double>).coord_dt.rot.m_data[0];
    dVar9 = (this->super_ChFrameMoving<double>).coord_dt.rot.m_data[1];
    (this->last_rel_coord_dt).pos.m_data[1] =
         (this->super_ChFrameMoving<double>).coord_dt.pos.m_data[1];
    (this->last_rel_coord_dt).pos.m_data[2] = dVar11;
    (this->last_rel_coord_dt).rot.m_data[0] = dVar8;
    (this->last_rel_coord_dt).rot.m_data[1] = dVar9;
    dVar11 = (this->super_ChFrameMoving<double>).coord_dt.rot.m_data[3];
    (this->last_rel_coord_dt).rot.m_data[2] =
         (this->super_ChFrameMoving<double>).coord_dt.rot.m_data[2];
    (this->last_rel_coord_dt).rot.m_data[3] = dVar11;
    return;
  }
  return;
}

Assistant:

void ChMarker::UpdatedExternalTime(double prevtime, double mtime) {
    double mstep = mtime - prevtime;

    Coordsys m_rel_pos_dt;
    Coordsys m_rel_pos_dtdt;

    // do not try to switch on the M_MOTION_KEYFRAMED mode if
    // we are already in the M_MOTION_EXTERNAL mode, maybe because
    // a link point-surface is already moving the marker and
    // it will handle the accelerations by itself
    if (this->motion_type == M_MOTION_EXTERNAL)
        return;

    // otherwise see if a BDF is needed, cause an external 3rd party is moving the marker
    this->motion_type = M_MOTION_FUNCTIONS;

    // if POSITION or ROTATION ("rel_pos") has been changed in acceptable time step...
    if ((!(Vequal(coord.pos, last_rel_coord.pos)) || !(Qequal(coord.rot, last_rel_coord.rot))) && (fabs(mstep) < 0.1) &&
        (mstep != 0)) {
        // ... and if motion wasn't caused by motion laws, then it was a keyframed movement!
        if ((motion_X->Get_y(mtime) == 0) && (motion_Y->Get_y(mtime) == 0) && (motion_Z->Get_y(mtime) == 0) &&
            (motion_ang->Get_y(mtime) == 0) && (motion_X->Get_Type() == ChFunction::FUNCT_CONST) &&
            (motion_Y->Get_Type() == ChFunction::FUNCT_CONST) && (motion_Z->Get_Type() == ChFunction::FUNCT_CONST) &&
            (motion_ang->Get_Type() == ChFunction::FUNCT_CONST)) {
            // compute the relative speed by BDF !
            m_rel_pos_dt.pos = Vmul(Vsub(coord.pos, last_rel_coord.pos), 1 / mstep);
            m_rel_pos_dt.rot = Qscale(Qsub(coord.rot, last_rel_coord.rot), 1 / mstep);

            // compute the relative acceleration by BDF !
            m_rel_pos_dtdt.pos = Vmul(Vsub(m_rel_pos_dt.pos, last_rel_coord_dt.pos), 1 / mstep);
            m_rel_pos_dtdt.rot = Qscale(Qsub(m_rel_pos_dt.rot, last_rel_coord_dt.rot), 1 / mstep);

            // Set the position, speed and acceleration in relative space,
            // automatically getting also the absolute values,
            SetCoord_dt(m_rel_pos_dt);
            SetCoord_dtdt(m_rel_pos_dtdt);

            // update the remaining state variables
            this->UpdateState();

            // remember that the movement of this guy won't need further update
            // of speed and acc. via motion laws!
            this->motion_type = M_MOTION_KEYFRAMED;
        }
    }

    // restore state buffers and that's all.
    last_time = ChTime;
    last_rel_coord = coord;
    last_rel_coord_dt = coord_dt;
}